

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O2

RPCHelpMan * getdescriptorinfo(void)

{
  long lVar1;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_08;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff458;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff45c;
  undefined8 in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  _Manager_type in_stack_fffffffffffff478;
  undefined8 in_stack_fffffffffffff480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff488;
  pointer in_stack_fffffffffffff498;
  pointer pRVar5;
  pointer in_stack_fffffffffffff4a0;
  pointer pRVar6;
  pointer in_stack_fffffffffffff4a8;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff4b0;
  pointer in_stack_fffffffffffff4b8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff4c0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff4c8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff4d0;
  pointer in_stack_fffffffffffff4d8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff4e0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff4e8;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff4f0;
  pointer in_stack_fffffffffffff4f8;
  pointer pRVar14;
  pointer in_stack_fffffffffffff500;
  pointer pRVar15;
  pointer in_stack_fffffffffffff508;
  undefined8 in_stack_fffffffffffff510;
  pointer in_stack_fffffffffffff518;
  pointer in_stack_fffffffffffff520;
  pointer in_stack_fffffffffffff528;
  undefined1 in_stack_fffffffffffff530 [16];
  allocator<char> local_aaa;
  allocator<char> local_aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_aa8;
  allocator<char> local_a8a;
  allocator<char> local_a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a88;
  allocator<char> local_a6a;
  allocator<char> local_a69;
  RPCResults local_a68;
  allocator_type local_a4b;
  allocator<char> local_a4a;
  allocator<char> local_a49;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a48;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  string local_9e8;
  string local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968;
  string local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  char *local_8e8;
  size_type local_8e0;
  char local_8d8 [8];
  undefined8 uStack_8d0;
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  RPCResult local_788;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  RPCResult local_680 [4];
  RPCResult local_460;
  RPCResult local_3d8;
  string local_350 [32];
  string local_330 [32];
  RPCResult local_310;
  RPCArgOptions local_288;
  string local_240 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_220;
  undefined1 local_1c8;
  string local_1c0 [32];
  RPCArg local_1a0;
  string local_98 [32];
  string local_78 [32];
  string EXAMPLE_DESCRIPTOR;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EXAMPLE_DESCRIPTOR,
             "wpkh([d34db33f/84h/0h/0h]0279be667ef9dcbbac55a06295Ce870b07029Bfcdb2dce28d959f2815b16f81798)"
             ,(allocator<char> *)local_680);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"getdescriptorinfo",&local_a29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"\nAnalyses a descriptor.\n",&local_a2a);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"descriptor",&local_a49);
  local_220._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1c8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_240,"The descriptor.",&local_a4a);
  local_288.oneline_description._M_dataplus._M_p = (pointer)&local_288.oneline_description.field_2;
  local_288.skip_type_check = false;
  local_288.oneline_description._M_string_length = 0;
  local_288.oneline_description.field_2._M_local_buf[0] = '\0';
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_288._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff458;
  name._M_string_length = in_stack_fffffffffffff460;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  name.field_2._8_8_ = in_stack_fffffffffffff470;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff480;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff478;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff488;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff498;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff4a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff4a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff4b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff4b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff4c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff4c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff4d0;
  description_08._M_string_length = (size_type)in_stack_fffffffffffff4e0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff4e8;
  description_08.field_2._8_8_ = in_stack_fffffffffffff4f0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff500;
  opts._0_8_ = in_stack_fffffffffffff4f8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff508;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff510;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff518;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff520;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff528;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff530._0_8_;
  opts.hidden = (bool)in_stack_fffffffffffff530[8];
  opts.also_positional = (bool)in_stack_fffffffffffff530[9];
  opts._66_6_ = in_stack_fffffffffffff530._10_6_;
  RPCArg::RPCArg(&local_1a0,name,(Type)local_1c0,fallback,description_08,opts);
  __l._M_len = 1;
  __l._M_array = &local_1a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_a48,__l,&local_a4b);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_a69);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"",&local_a6a);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"descriptor",&local_a89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c0,
             "The descriptor in canonical form, without private keys. For a multipath descriptor, only the first will be returned."
             ,&local_a8a);
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff458;
  m_key_name._M_string_length = in_stack_fffffffffffff460;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff470;
  description._M_string_length = in_stack_fffffffffffff480;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description.field_2 = in_stack_fffffffffffff488;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff4a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff498;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult(local_680,STR,m_key_name,description,inner,SUB81(local_6a0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"multipath_expansion",&local_aa9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,
             "All descriptors produced by expanding multipath derivation elements. Only if the provided descriptor specifies multipath derivation elements."
             ,&local_aaa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"",(allocator<char> *)&stack0xfffffffffffff537);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7c8,"",(allocator<char> *)&stack0xfffffffffffff536);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff458;
  m_key_name_00._M_string_length = in_stack_fffffffffffff460;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff470;
  description_00._M_string_length = in_stack_fffffffffffff480;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_00.field_2 = in_stack_fffffffffffff488;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff498;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult(&local_788,STR,m_key_name_00,description_00,inner_00,SUB81(local_7a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538,__l_00,
             (allocator_type *)&stack0xfffffffffffff517);
  uVar4 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff460;
  auVar2._0_4_ = in_stack_fffffffffffff45c;
  auVar2._12_8_ = in_stack_fffffffffffff468;
  auVar2._20_8_ = in_stack_fffffffffffff470;
  auVar2._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff480;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_01.field_2 = in_stack_fffffffffffff488;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff498;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult
            (local_680 + 1,ARR,(string)(auVar2 << 0x20),SUB81(local_6e0,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e8,"checksum",(allocator<char> *)&stack0xfffffffffffff516);
  std::__cxx11::string::string<std::allocator<char>>
            (local_808,"The checksum for the input descriptor",
             (allocator<char> *)&stack0xfffffffffffff515);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_01._M_string_length = in_stack_fffffffffffff460;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff470;
  description_02._M_string_length = in_stack_fffffffffffff480;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_02.field_2 = in_stack_fffffffffffff488;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff498;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult(local_680 + 2,STR,m_key_name_01,description_02,inner_02,SUB81(local_7e8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_828,"isrange",(allocator<char> *)&stack0xfffffffffffff4f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_848,"Whether the descriptor is ranged",
             (allocator<char> *)&stack0xfffffffffffff4f6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_02._M_string_length = in_stack_fffffffffffff460;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff470;
  description_03._M_string_length = in_stack_fffffffffffff480;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_03.field_2 = in_stack_fffffffffffff488;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff498;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult(local_680 + 3,BOOL,m_key_name_02,description_03,inner_03,SUB81(local_828,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_868,"issolvable",(allocator<char> *)&stack0xfffffffffffff4d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_888,"Whether the descriptor is solvable",
             (allocator<char> *)&stack0xfffffffffffff4d6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_03._M_string_length = in_stack_fffffffffffff460;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff470;
  description_04._M_string_length = in_stack_fffffffffffff480;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_04.field_2 = in_stack_fffffffffffff488;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff498;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4a8;
  RPCResult::RPCResult(&local_460,BOOL,m_key_name_03,description_04,inner_04,SUB81(local_868,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a8,"hasprivatekeys",(allocator<char> *)&stack0xfffffffffffff4b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c8,"Whether the input descriptor contained at least one private key",
             (allocator<char> *)&stack0xfffffffffffff4b6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_04._M_string_length = in_stack_fffffffffffff460;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff470;
  description_05._M_string_length = in_stack_fffffffffffff480;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_05.field_2._M_local_buf = in_stack_fffffffffffff488._M_local_buf;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_3d8,BOOL,m_key_name_04,description_05,inner_05,SUB81(local_8a8,0));
  __l_01._M_len = 6;
  __l_01._M_array = local_680;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a88,__l_01,(allocator_type *)&stack0xfffffffffffff497);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff45c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_05._M_string_length = in_stack_fffffffffffff460;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff470;
  description_06._M_string_length = in_stack_fffffffffffff480;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff478;
  description_06.field_2 = in_stack_fffffffffffff488;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_310,OBJ,m_key_name_05,description_06,inner_06,SUB81(local_330,0));
  result._4_4_ = in_stack_fffffffffffff45c;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff460;
  result.m_key_name._M_string_length = in_stack_fffffffffffff468;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff470;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff478;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff480;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff488;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)pRVar6;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff4b0;
  result.m_description.field_2._8_8_ = pRVar8;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar9;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_cond.field_2._8_8_ = pRVar11;
  RPCResults::RPCResults(&local_a68,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"getdescriptorinfo",(allocator<char> *)&stack0xfffffffffffff496);
  std::operator+(&local_9a8,"\"",&EXAMPLE_DESCRIPTOR);
  std::operator+(&local_988,&local_9a8,"\"");
  HelpExampleCli(&local_948,&local_968,&local_988);
  std::operator+(&local_928,"Analyse a descriptor\n",&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e8,"getdescriptorinfo",(allocator<char> *)&stack0xfffffffffffff495);
  std::operator+(&local_a28,"\"",&EXAMPLE_DESCRIPTOR);
  std::operator+(&local_a08,&local_a28,"\"");
  HelpExampleRpc(&local_9c8,&local_9e8,&local_a08);
  std::operator+(&local_908,&local_928,&local_9c8);
  local_8e8 = local_8d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p == &local_908.field_2) {
    uStack_8d0 = local_908.field_2._8_8_;
  }
  else {
    local_8e8 = local_908._M_dataplus._M_p;
  }
  local_8e0 = local_908._M_string_length;
  local_908._M_string_length = 0;
  local_908.field_2._M_local_buf[0] = '\0';
  description_07._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:194:9)>
       ::_M_invoke;
  description_07._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:194:9)>
                ::_M_manager;
  description_07.field_2 = in_stack_fffffffffffff488;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4b0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4d0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar11;
  examples.m_examples.field_2._8_8_ = pRVar12;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff4f0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar14;
  fun._M_invoker = (_Invoker_type)pRVar15;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff460,&stack0xfffffffffffff468)),
             description_07,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff468);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_968);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a68.m_results);
  RPCResult::~RPCResult(&local_310);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a88);
  lVar3 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_680[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff498);
  std::__cxx11::string::~string(local_8c8);
  std::__cxx11::string::~string(local_8a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4b8);
  std::__cxx11::string::~string(local_888);
  std::__cxx11::string::~string(local_868);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8);
  std::__cxx11::string::~string(local_848);
  std::__cxx11::string::~string(local_828);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
  std::__cxx11::string::~string(local_808);
  std::__cxx11::string::~string(local_7e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538);
  RPCResult::~RPCResult(&local_788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  std::__cxx11::string::~string(local_7c8);
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_6e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_aa8);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_330);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a48);
  RPCArg::~RPCArg(&local_1a0);
  RPCArgOptions::~RPCArgOptions(&local_288);
  std::__cxx11::string::~string(local_240);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_220._M_first);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&EXAMPLE_DESCRIPTOR);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getdescriptorinfo()
{
    const std::string EXAMPLE_DESCRIPTOR = "wpkh([d34db33f/84h/0h/0h]0279be667ef9dcbbac55a06295Ce870b07029Bfcdb2dce28d959f2815b16f81798)";

    return RPCHelpMan{"getdescriptorinfo",
        {"\nAnalyses a descriptor.\n"},
        {
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "descriptor", "The descriptor in canonical form, without private keys. For a multipath descriptor, only the first will be returned."},
                {RPCResult::Type::ARR, "multipath_expansion", /*optional=*/true, "All descriptors produced by expanding multipath derivation elements. Only if the provided descriptor specifies multipath derivation elements.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
                {RPCResult::Type::STR, "checksum", "The checksum for the input descriptor"},
                {RPCResult::Type::BOOL, "isrange", "Whether the descriptor is ranged"},
                {RPCResult::Type::BOOL, "issolvable", "Whether the descriptor is solvable"},
                {RPCResult::Type::BOOL, "hasprivatekeys", "Whether the input descriptor contained at least one private key"},
            }
        },
        RPCExamples{
            "Analyse a descriptor\n" +
            HelpExampleCli("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"") +
            HelpExampleRpc("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            FlatSigningProvider provider;
            std::string error;
            auto descs = Parse(request.params[0].get_str(), provider, error);
            if (descs.empty()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
            }

            UniValue result(UniValue::VOBJ);
            result.pushKV("descriptor", descs.at(0)->ToString());

            if (descs.size() > 1) {
                UniValue multipath_descs(UniValue::VARR);
                for (const auto& d : descs) {
                    multipath_descs.push_back(d->ToString());
                }
                result.pushKV("multipath_expansion", multipath_descs);
            }

            result.pushKV("checksum", GetDescriptorChecksum(request.params[0].get_str()));
            result.pushKV("isrange", descs.at(0)->IsRange());
            result.pushKV("issolvable", descs.at(0)->IsSolvable());
            result.pushKV("hasprivatekeys", provider.keys.size() > 0);
            return result;
        },
    };
}